

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_entity_sets.cc
# Opt level: O3

AllCodimMeshDataSet<bool> *
lf::mesh::utils::flagEntitiesOnBoundary
          (AllCodimMeshDataSet<bool> *__return_storage_ptr__,
          shared_ptr<const_lf::mesh::Mesh> *mesh_p)

{
  undefined8 *puVar1;
  element_type *peVar2;
  Entity *e;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  uint *puVar6;
  undefined4 extraout_var_00;
  bool *pbVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  CodimMeshDataSet<unsigned_int> no_adjacent_cells;
  CodimMeshDataSet<unsigned_int> local_68;
  undefined8 *puVar5;
  
  CountNumSuperEntities(&local_68,mesh_p,1,1);
  AllCodimMeshDataSet<bool>::AllCodimMeshDataSet<bool,void>(__return_storage_ptr__,mesh_p,false);
  peVar2 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar3 = (*peVar2->_vptr_Mesh[2])(peVar2,1);
  puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar3);
  if (extraout_RDX != 0) {
    puVar1 = puVar5 + extraout_RDX;
    do {
      e = (Entity *)*puVar5;
      puVar6 = CodimMeshDataSet<unsigned_int>::operator()(&local_68,e);
      if (*puVar6 == 1) {
        uVar4 = (**((mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->_vptr_Mesh)();
        if (uVar4 != 0) {
          uVar10 = 0;
          do {
            iVar3 = (*e->_vptr_Entity[1])(e,uVar10);
            if (extraout_RDX_00 != 0) {
              lVar8 = 0;
              do {
                pbVar7 = AllCodimMeshDataSet<bool>::operator()
                                   (__return_storage_ptr__,
                                    *(Entity **)(CONCAT44(extraout_var_00,iVar3) + lVar8));
                *pbVar7 = true;
                lVar8 = lVar8 + 8;
              } while (extraout_RDX_00 << 3 != lVar8);
            }
            uVar9 = (int)uVar10 + 1;
            uVar10 = (ulong)uVar9;
          } while (uVar9 != uVar4);
        }
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  local_68.super_MeshDataSet<unsigned_int>._vptr_MeshDataSet =
       (_func_int **)&PTR_operator___00494168;
  if (local_68.data_.m_holder.m_capacity != 0) {
    operator_delete(local_68.data_.m_holder.m_start,local_68.data_.m_holder.m_capacity << 2);
  }
  if (local_68.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

AllCodimMeshDataSet<bool> flagEntitiesOnBoundary(
    const std::shared_ptr<const Mesh>& mesh_p) {
  // count cells adjacent to entities of co-dimension 1
  CodimMeshDataSet<lf::base::size_type> no_adjacent_cells{
      CountNumSuperEntities(mesh_p, 1, 1)};
  // flag array
  AllCodimMeshDataSet<bool> bd_flags{mesh_p, false};

  // Run through faces (entities of co-dimension 1) and flag sub-entities
  for (const lf::mesh::Entity* edge : mesh_p->Entities(1)) {
    if (no_adjacent_cells(*edge) == 1) {
      // Boundary face detected!
      // Traverse all sub-entities of all co-dimensions
      const lf::base::dim_t dim_mesh = mesh_p->DimMesh();
      for (lf::base::dim_t rel_codim = 0; rel_codim < dim_mesh; rel_codim++) {
        for (const lf::mesh::Entity* subent : edge->SubEntities(rel_codim)) {
          bd_flags(*subent) = true;
        }
      }
    }
  }
  return bd_flags;
}